

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

char * unmakemask(int mask,char *smask)

{
  bool bVar1;
  uint local_1c;
  int i;
  char *smask_local;
  int mask_local;
  
  bVar1 = (mask & 1U) != 0;
  if (bVar1) {
    *smask = 'c';
  }
  local_1c = (uint)bVar1;
  if ((mask & 2U) != 0) {
    smask[(int)local_1c] = 'r';
    local_1c = local_1c + 1;
  }
  if ((mask & 4U) != 0) {
    smask[(int)local_1c] = 'l';
    local_1c = local_1c + 1;
  }
  smask[(int)local_1c] = '\0';
  return smask;
}

Assistant:

static char *unmakemask (int mask, char *smask) {
  int i = 0;
  if (mask & LUA_MASKCALL) smask[i++] = 'c';
  if (mask & LUA_MASKRET) smask[i++] = 'r';
  if (mask & LUA_MASKLINE) smask[i++] = 'l';
  smask[i] = '\0';
  return smask;
}